

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void filemgr_remove_pending(filemgr *old_file,filemgr *new_file,err_log_callback *log_callback)

{
  pthread_spinlock_t *__lock;
  fdb_status io_error;
  filemgr *pfVar1;
  
  if (new_file == (filemgr *)0x0) {
    return;
  }
  __lock = &old_file->lock;
  pthread_spin_lock(__lock);
  if ((old_file->ref_count).super___atomic_base<unsigned_int>._M_i != 0) {
    assign_new_filename(old_file,new_file->filename);
    LOCK();
    (old_file->status).super___atomic_base<unsigned_char>._M_i = '\x04';
    UNLOCK();
    io_error = unlink(old_file->filename);
    _log_errno_str(old_file->ops,log_callback,io_error,"UNLINK",old_file->filename);
    pthread_spin_unlock(__lock);
    pthread_spin_lock(&new_file->lock);
    assign_old_filename(new_file,old_file->filename);
    pthread_spin_unlock(&new_file->lock);
    return;
  }
  pthread_spin_unlock(__lock);
  pfVar1 = filemgr_get_instance(old_file->new_filename);
  if ((lazy_file_deletion_enabled != true) ||
     ((pfVar1 != (filemgr *)0x0 && (pfVar1->in_place_compaction == true)))) {
    remove(old_file->filename);
  }
  filemgr_remove_file(old_file,log_callback);
  return;
}

Assistant:

void filemgr_remove_pending(struct filemgr *old_file,
                            struct filemgr *new_file,
                            err_log_callback *log_callback)
{
    if (new_file == NULL) {
        return;
    }

    spin_lock(&old_file->lock);
    if (atomic_get_uint32_t(&old_file->ref_count) > 0) {
        // delay removing
        assign_new_filename(old_file, new_file->filename);
        atomic_store_uint8_t(&old_file->status, FILE_REMOVED_PENDING);

#if !(defined(WIN32) || defined(_WIN32))
        // Only for Posix
        int ret;
        ret = unlink(old_file->filename);
        _log_errno_str(old_file->ops, log_callback, (fdb_status)ret,
                       "UNLINK", old_file->filename);
#endif

        spin_unlock(&old_file->lock);

        // Update new_file's old_filename
        spin_lock(&new_file->lock);
        assign_old_filename(new_file, old_file->filename);
        spin_unlock(&new_file->lock);
    } else {
        // immediatly remove
        // LCOV_EXCL_START
        spin_unlock(&old_file->lock);

        struct filemgr *new_file_of_old_file =
            filemgr_get_instance(old_file->new_filename);

        if (!lazy_file_deletion_enabled ||
            (new_file_of_old_file && new_file_of_old_file->in_place_compaction)) {
            remove(old_file->filename);
        }
        filemgr_remove_file(old_file, log_callback);
        // LCOV_EXCL_STOP
    }
}